

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

int fmt::v8::detail::parse_nonnegative_int<char32_t>(char32_t **begin,char32_t *end,int error_value)

{
  char32_t *pcVar1;
  char32_t *pcVar2;
  long lVar3;
  char32_t cVar4;
  uint uVar5;
  ulong uVar6;
  char32_t cVar7;
  long lVar8;
  
  pcVar2 = *begin;
  if ((pcVar2 == end) || (9 < (uint)(*pcVar2 + L'\xffffffd0'))) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8ca,"");
  }
  uVar5 = 0;
  lVar3 = 4;
  cVar4 = *pcVar2;
  do {
    cVar7 = cVar4;
    lVar8 = lVar3;
    uVar6 = (ulong)uVar5;
    uVar5 = (cVar7 + uVar5 * 10) - 0x30;
    pcVar1 = (char32_t *)((long)pcVar2 + lVar8);
    if (pcVar1 == end) break;
    lVar3 = lVar8 + 4;
    cVar4 = *pcVar1;
  } while ((uint)(*pcVar1 + L'\xffffffd0') < 10);
  *begin = pcVar1;
  if ((0x27 < lVar8) &&
     ((lVar8 != 0x28 ||
      (((ulong)(uint)(cVar7 + L'\xffffffd0') + uVar6 * 10 & 0xffffffff80000000) != 0)))) {
    uVar5 = error_value;
  }
  return uVar5;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}